

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpserver.cpp
# Opt level: O0

void StartHTTPServer(void)

{
  string_view logging_function;
  int iVar1;
  vector<std::thread,_std::allocator<std::thread>_> *this;
  _func_void_WorkQueue<HTTPClosure>_ptr_int *__args;
  long in_FS_OFFSET;
  int i;
  int rpcThreads;
  Level in_stack_000000d0;
  int *in_stack_000000e0;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffff2c;
  ArgsManager *in_stack_ffffffffffffff30;
  char *__t;
  int64_t in_stack_ffffffffffffff38;
  thread *this_00;
  int *in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff48;
  allocator<char> *__args_00;
  allocator<char> *in_stack_ffffffffffffff68;
  char *__f;
  thread *in_stack_ffffffffffffff70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff78;
  int local_74;
  LogFlags in_stack_ffffffffffffff90;
  int in_stack_ffffffffffffff9c;
  allocator<char> local_39;
  vector<std::thread,_std::allocator<std::thread>_> *local_38;
  int local_2c;
  ConstevalFormatString<1U> in_stack_ffffffffffffffd8;
  string_view in_stack_ffffffffffffffe0;
  size_t in_stack_fffffffffffffff0;
  char *pcVar3;
  
  pcVar3 = *(char **)(in_FS_OFFSET + 0x28);
  __args_00 = &local_39;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff78,(char *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  this = (vector<std::thread,_std::allocator<std::thread>_> *)
         ArgsManager::GetIntArg
                   (in_stack_ffffffffffffff30,
                    (string *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
                    in_stack_ffffffffffffff38);
  local_38 = this;
  __args = (_func_void_WorkQueue<HTTPClosure>_ptr_int *)
           std::max<long>((long *)in_stack_ffffffffffffff30,
                          (long *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  iVar1 = (int)*(long *)__args;
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  std::allocator<char>::~allocator(&local_39);
  local_2c = iVar1;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff48),(char *)in_stack_ffffffffffffff40);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)
             CONCAT44(iVar1,in_stack_ffffffffffffff48),(char *)in_stack_ffffffffffffff40);
  __f = "Starting HTTP server with %d worker threads\n";
  this_00 = (thread *)&local_2c;
  uVar2 = 2;
  __t = "Starting HTTP server with %d worker threads\n";
  logging_function._M_str = pcVar3;
  logging_function._M_len = in_stack_fffffffffffffff0;
  LogPrintFormatInternal<int>
            (logging_function,in_stack_ffffffffffffffe0,in_stack_ffffffffffffff9c,
             in_stack_ffffffffffffff90,in_stack_000000d0,in_stack_ffffffffffffffd8,in_stack_000000e0
            );
  std::thread::thread<void(&)(event_base*),event_base*&,void>
            (in_stack_ffffffffffffff70,(_func_void_event_base_ptr *)__f,(event_base **)__args_00);
  std::thread::operator=(this_00,(thread *)__t);
  std::thread::~thread((thread *)CONCAT44(in_stack_ffffffffffffff2c,uVar2));
  for (local_74 = 0; local_74 < local_2c; local_74 = local_74 + 1) {
    std::unique_ptr<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_>::get
              ((unique_ptr<WorkQueue<HTTPClosure>,_std::default_delete<WorkQueue<HTTPClosure>_>_> *)
               CONCAT44(in_stack_ffffffffffffff2c,uVar2));
    std::vector<std::thread,std::allocator<std::thread>>::
    emplace_back<void(&)(WorkQueue<HTTPClosure>*,int),WorkQueue<HTTPClosure>*,int&>
              (this,__args,(WorkQueue<HTTPClosure> **)CONCAT44(iVar1,in_stack_ffffffffffffff48),
               in_stack_ffffffffffffff40);
  }
  if (*(char **)(in_FS_OFFSET + 0x28) == pcVar3) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void StartHTTPServer()
{
    int rpcThreads = std::max((long)gArgs.GetIntArg("-rpcthreads", DEFAULT_HTTP_THREADS), 1L);
    LogInfo("Starting HTTP server with %d worker threads\n", rpcThreads);
    g_thread_http = std::thread(ThreadHTTP, eventBase);

    for (int i = 0; i < rpcThreads; i++) {
        g_thread_http_workers.emplace_back(HTTPWorkQueueRun, g_work_queue.get(), i);
    }
}